

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_curr(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  int iVar2;
  history_t *h;
  HistEvent_conflict *ev_local;
  void *p_local;
  
  if (*(void **)((long)p + 0x28) == p) {
    iVar2 = 5;
    if (0 < *(int *)((long)p + 0x34)) {
      iVar2 = 8;
    }
    ev->num = iVar2;
    iVar2 = 5;
    if (0 < *(int *)((long)p + 0x34)) {
      iVar2 = 8;
    }
    ev->str = he_errlist[iVar2];
    p_local._4_4_ = -1;
  }
  else {
    puVar1 = *(undefined8 **)((long)p + 0x28);
    *(undefined8 *)ev = *puVar1;
    ev->str = (char *)puVar1[1];
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_curr(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev,
		    (h->cur > 0) ? _HE_CURR_INVALID : _HE_EMPTY_LIST);
		return -1;
	}

	return 0;
}